

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  cmake *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  ostringstream e;
  string local_1d0;
  _Rb_tree_node_base *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  psVar1 = &this->PropertyName;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    if (((this->Remove == false) &&
        (bVar7 = cmSystemTools::IsOn((this->PropertyValue)._M_dataplus._M_p), !bVar7)) &&
       (bVar7 = cmSystemTools::IsOff((this->PropertyValue)._M_dataplus._M_p), !bVar7)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"given non-boolean value \"",0x19);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->PropertyValue)._M_dataplus._M_p,
                          (this->PropertyValue)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" for CACHE property \"ADVANCED\".  ",0x22);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1d0);
      goto LAB_002c2a67;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)local_1a8,(this->PropertyValue)._M_dataplus._M_p,(allocator *)&local_1d0)
      ;
      bVar7 = cmState::IsCacheEntryType((string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (!bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given invalid CACHE entry TYPE \"",0x20);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->PropertyValue)._M_dataplus._M_p,
                            (this->PropertyValue)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1d0);
        goto LAB_002c2a67;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)psVar1), iVar2 != 0)) &&
         (iVar2 = std::__cxx11::string::compare((char *)psVar1), iVar2 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given invalid CACHE property ",0x1d);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->PropertyName)._M_dataplus._M_p,
                            (this->PropertyName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".  ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Settable CACHE properties are: ",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.",0x2f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1d0);
LAB_002c2a67:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
    }
  }
  p_Var6 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0 = &(this->Names)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar7 = p_Var6 == local_1b0;
  if (!bVar7) {
    do {
      pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      pcVar5 = cmState::GetCacheEntryValue(pcVar4->State,(string *)(p_Var6 + 1));
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"could not find CACHE variable ",0x1e);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,".  Perhaps it has not yet been created.",0x27);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        HandleCacheEntry(this,(string *)(p_Var6 + 1));
      }
      if (pcVar5 == (char *)0x0) {
        return bVar7;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      bVar7 = p_Var6 == local_1b0;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if(this->PropertyName == "ADVANCED")
    {
    if(!this->Remove &&
       !cmSystemTools::IsOn(this->PropertyValue.c_str()) &&
       !cmSystemTools::IsOff(this->PropertyValue.c_str()))
      {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << "\" for CACHE property \"ADVANCED\".  ";
      this->SetError(e.str());
      return false;
      }
    }
  else if(this->PropertyName == "TYPE")
    {
    if(!cmState::IsCacheEntryType(this->PropertyValue.c_str()))
      {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
      }
    }
  else if(this->PropertyName != "HELPSTRING" &&
          this->PropertyName != "STRINGS" &&
          this->PropertyName != "VALUE")
    {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
    }

  for(std::set<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end(); ++ni)
    {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue
                          = cm->GetState()->GetCacheEntryValue(*ni);
    if(existingValue)
      {
      if(!this->HandleCacheEntry(*ni))
        {
        return false;
        }
      }
    else
      {
      std::ostringstream e;
      e << "could not find CACHE variable " << *ni
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
      }
    }
  return true;
}